

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

int Nf_SetAddCut(Nf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  Nf_Cut_t *pNVar1;
  Nf_Cut_t *pNVar2;
  int iVar3;
  Nf_Cut_t *t;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  int nSizeC;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (nCuts == 0) {
    return 1;
  }
  if (0 < nCuts) {
    uVar5 = (ulong)(uint)nCuts;
    bVar6 = true;
    uVar4 = 0;
LAB_007352de:
    pNVar1 = pCuts[uVar5];
    uVar8 = *(uint *)&pNVar1->field_0x10 >> 0x1b;
    do {
      pNVar2 = pCuts[uVar4];
      uVar10 = *(uint *)&pNVar2->field_0x10 >> 0x1b;
      if ((uVar8 < uVar10) && ((pNVar1->Sign & ~pNVar2->Sign) == 0)) {
        if (*(uint *)&pNVar1->field_0x10 < 0x8000000) goto LAB_00735345;
        uVar11 = 0;
        uVar9 = 0;
        do {
          if (pNVar1->pLeaves[(int)uVar9] < pNVar2->pLeaves[uVar11]) break;
          if ((pNVar2->pLeaves[uVar11] == pNVar1->pLeaves[(int)uVar9]) &&
             (uVar9 = uVar9 + 1, uVar9 == uVar8)) goto LAB_00735345;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      uVar4 = uVar4 + 1;
      if (uVar4 == uVar5) {
        if (!bVar6) goto LAB_0073536b;
        goto LAB_007353a1;
      }
    } while( true );
  }
  goto LAB_00735414;
LAB_00735345:
  *(uint *)&pNVar2->field_0x10 = *(uint *)&pNVar2->field_0x10 | 0xf8000000;
  uVar4 = uVar4 + 1;
  bVar6 = false;
  if (uVar4 == uVar5) goto LAB_0073536b;
  goto LAB_007352de;
LAB_0073536b:
  uVar5 = 0;
  iVar3 = 0;
  do {
    if (*(uint *)&pCuts[uVar5]->field_0x10 < 0xf8000000) {
      lVar7 = (long)iVar3;
      if (lVar7 < (long)uVar5) {
        pNVar1 = pCuts[lVar7];
        pCuts[lVar7] = pCuts[uVar5];
        pCuts[uVar5] = pNVar1;
      }
      iVar3 = iVar3 + 1;
    }
    uVar5 = uVar5 + 1;
  } while (nCuts + 1 != uVar5);
  nCuts = iVar3 - 1;
LAB_007353a1:
  uVar8 = nCuts;
  if (0 < nCuts) {
    while( true ) {
      pNVar1 = pCuts[(ulong)uVar8 - 1];
      pNVar2 = pCuts[uVar8];
      uVar9 = *(uint *)&pNVar1->field_0x10 >> 0x1a & 1;
      uVar10 = *(uint *)&pNVar2->field_0x10 >> 0x1a & 1;
      if (uVar9 < uVar10) break;
      if (uVar9 <= uVar10) {
        if (pNVar1->Flow < pNVar2->Flow) break;
        if (pNVar1->Flow <= pNVar2->Flow) {
          if ((pNVar1->Delay < pNVar2->Delay) ||
             ((pNVar1->Delay <= pNVar2->Delay &&
              (*(uint *)&pNVar1->field_0x10 >> 0x1b < *(uint *)&pNVar2->field_0x10 >> 0x1b))))
          break;
        }
      }
      pCuts[(ulong)uVar8 - 1] = pNVar2;
      pCuts[uVar8] = pNVar1;
      bVar6 = (int)uVar8 < 2;
      uVar8 = uVar8 - 1;
      if (bVar6) break;
    }
  }
LAB_00735414:
  iVar3 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar3 = nCuts + 1U;
  }
  return iVar3;
}

Assistant:

static inline int Nf_SetAddCut( Nf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Nf_SetLastCutContainsArea(pCuts, nCuts);
    Nf_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}